

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderDimmedBackgrounds(void)

{
  ImVec2 cr_min;
  ImGuiWindow *pIVar1;
  float fVar2;
  ImVec2 *unaff_retaddr;
  undefined4 in_stack_00000008;
  ImU32 in_stack_0000000c;
  ImGuiWindow *in_stack_00000010;
  ImRect bb;
  float distance;
  ImGuiViewport *viewport;
  ImGuiWindow *window;
  ImGuiWindow *dim_behind_window;
  bool dim_bg_for_window_list;
  bool dim_bg_for_modal;
  ImGuiWindow *modal_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff68;
  ImDrawList *this;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 intersect_with_current_clip_rect;
  ImGuiWindow *in_stack_ffffffffffffff90;
  ImGuiWindow *this_00;
  ImVec2 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar3;
  ImRect local_44;
  float local_34;
  ImGuiViewport *local_30;
  ImGuiWindow *local_28;
  ImGuiWindow *local_20;
  byte local_12;
  undefined1 local_11;
  ImGuiContext *pIVar4;
  
  intersect_with_current_clip_rect = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  pIVar4 = GImGui;
  pIVar1 = GetTopMostAndVisiblePopupModal();
  if ((0.0 < pIVar4->DimBgRatio) || (0.0 < pIVar4->NavWindowingHighlightAlpha)) {
    local_11 = pIVar1 != (ImGuiWindow *)0x0;
    bVar3 = 0;
    if (pIVar4->NavWindowingTargetAnim != (ImGuiWindow *)0x0) {
      bVar3 = pIVar4->NavWindowingTargetAnim->Active;
    }
    local_12 = bVar3 & 1;
    if (((bool)local_11) || (local_12 != 0)) {
      if ((bool)local_11) {
        local_20 = FindBottomMostVisibleWindowWithinBeginStack(in_stack_ffffffffffffff90);
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                    (float)in_stack_ffffffffffffff80);
        RenderDimmedBackgroundBehindWindow(in_stack_00000010,in_stack_0000000c);
      }
      else if (local_12 != 0) {
        this_00 = pIVar4->NavWindowingTargetAnim;
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                    (float)in_stack_ffffffffffffff80);
        RenderDimmedBackgroundBehindWindow(in_stack_00000010,in_stack_0000000c);
        local_28 = pIVar4->NavWindowingTargetAnim;
        local_30 = GetMainViewport();
        local_34 = pIVar4->FontSize;
        local_44 = ImGuiWindow::Rect((ImGuiWindow *)0x1283eb);
        ImRect::Expand(&local_44,local_34);
        fVar2 = ImRect::GetWidth(&local_44);
        if (((local_30->Size).x <= fVar2) &&
           (fVar2 = ImRect::GetHeight(&local_44), (local_30->Size).y <= fVar2)) {
          ImRect::Expand(&local_44,-local_34 - 1.0);
        }
        if ((local_28->DrawList->CmdBuffer).Size == 0) {
          ImDrawList::AddDrawCmd((ImDrawList *)CONCAT17(bVar3,in_stack_ffffffffffffffa0));
        }
        this = local_28->DrawList;
        operator+(in_stack_ffffffffffffff68,(ImVec2 *)0x1284b0);
        cr_min.y._3_1_ = bVar3;
        cr_min._0_7_ = in_stack_ffffffffffffffa0;
        ImDrawList::PushClipRect
                  ((ImDrawList *)this_00,cr_min,in_stack_ffffffffffffff98,
                   (bool)intersect_with_current_clip_rect);
        GetColorU32((ImGuiCol)((ulong)&local_44 >> 0x20),SUB84(&local_44,0));
        ImDrawList::AddRect((ImDrawList *)in_stack_00000010,
                            (ImVec2 *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr,
                            (ImU32)((ulong)pIVar4 >> 0x20),SUB84(pIVar4,0),
                            (ImDrawFlags)((ulong)pIVar1 >> 0x20),SUB84(pIVar1,0));
        ImDrawList::PopClipRect(this);
      }
    }
  }
  return;
}

Assistant:

static void ImGui::RenderDimmedBackgrounds()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* modal_window = GetTopMostAndVisiblePopupModal();
    if (g.DimBgRatio <= 0.0f && g.NavWindowingHighlightAlpha <= 0.0f)
        return;
    const bool dim_bg_for_modal = (modal_window != NULL);
    const bool dim_bg_for_window_list = (g.NavWindowingTargetAnim != NULL && g.NavWindowingTargetAnim->Active);
    if (!dim_bg_for_modal && !dim_bg_for_window_list)
        return;

    if (dim_bg_for_modal)
    {
        // Draw dimming behind modal or a begin stack child, whichever comes first in draw order.
        ImGuiWindow* dim_behind_window = FindBottomMostVisibleWindowWithinBeginStack(modal_window);
        RenderDimmedBackgroundBehindWindow(dim_behind_window, GetColorU32(ImGuiCol_ModalWindowDimBg, g.DimBgRatio));
    }
    else if (dim_bg_for_window_list)
    {
        // Draw dimming behind CTRL+Tab target window
        RenderDimmedBackgroundBehindWindow(g.NavWindowingTargetAnim, GetColorU32(ImGuiCol_NavWindowingDimBg, g.DimBgRatio));

        // Draw border around CTRL+Tab target window
        ImGuiWindow* window = g.NavWindowingTargetAnim;
        ImGuiViewport* viewport = GetMainViewport();
        float distance = g.FontSize;
        ImRect bb = window->Rect();
        bb.Expand(distance);
        if (bb.GetWidth() >= viewport->Size.x && bb.GetHeight() >= viewport->Size.y)
            bb.Expand(-distance - 1.0f); // If a window fits the entire viewport, adjust its highlight inward
        if (window->DrawList->CmdBuffer.Size == 0)
            window->DrawList->AddDrawCmd();
        window->DrawList->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size);
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_NavWindowingHighlight, g.NavWindowingHighlightAlpha), window->WindowRounding, 0, 3.0f);
        window->DrawList->PopClipRect();
    }
}